

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O1

void __thiscall t_ocaml_generator::generate_const(t_ocaml_generator *this,t_const *tconst)

{
  t_type *type;
  pointer pcVar1;
  t_const_value *value;
  char *pcVar2;
  long lVar3;
  int iVar4;
  ostream *poVar5;
  string name;
  char *local_90;
  char local_80 [8];
  undefined8 uStack_78;
  char *local_70;
  long local_68;
  char local_60 [8];
  undefined8 uStack_58;
  string local_50;
  
  type = tconst->type_;
  pcVar1 = (tconst->name_)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (tconst->name_)._M_string_length);
  pcVar2 = local_70;
  iVar4 = tolower((int)*local_70);
  *pcVar2 = (char)iVar4;
  lVar3 = local_68;
  if (local_70 == local_60) {
    uStack_78 = uStack_58;
    local_90 = local_80;
  }
  else {
    local_90 = local_70;
  }
  local_68 = 0;
  local_60[0] = '\0';
  value = tconst->value_;
  local_70 = local_60;
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_consts_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"let ",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_90,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  render_const_value_abi_cxx11_(&local_50,this,type,value);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = decapitalize(tconst->get_name());
  t_const_value* value = tconst->get_value();

  indent(f_consts_) << "let " << name << " = " << render_const_value(type, value) << endl << endl;
}